

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

bool HasAddressTaken(VariableData *container)

{
  bool bVar1;
  uint uVar2;
  VmValueType VVar3;
  VmConstant **ppVVar4;
  VmConstant *pVVar5;
  VmValue *pVVar6;
  VmConstant *pVVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((container->isVmRegSpill == false) && (uVar8 = (ulong)(container->users).count, uVar8 != 0)) {
    ppVVar4 = (container->users).data;
    uVar9 = 0;
    do {
      pVVar5 = ppVVar4[uVar9];
      bVar1 = (pVVar5->super_VmValue).hasKnownNonSimpleUse;
      if ((pVVar5->super_VmValue).hasKnownSimpleUse == true) {
        if (bVar1 != false) {
          __assert_fail("!user->hasKnownNonSimpleUse",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                        ,0x128,"bool HasAddressTaken(VariableData *)");
        }
      }
      else {
        if (bVar1 != false) {
          return true;
        }
        uVar10 = (ulong)(pVVar5->super_VmValue).users.count;
        if (uVar10 != 0) {
          uVar11 = 0;
          do {
            pVVar6 = (pVVar5->super_VmValue).users.data[uVar11];
            if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
              __assert_fail("!\"invalid constant use\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                            ,0x160,"bool HasAddressTaken(VariableData *)");
            }
            uVar2 = *(uint *)&pVVar6[1]._vptr_VmValue;
            if (6 < uVar2) {
              if ((uVar2 - 8 < 7) || (uVar2 == 0x1a)) {
                if (pVVar6[1].type.type == VM_TYPE_VOID) goto LAB_00287317;
                pVVar7 = (VmConstant *)**(long **)&pVVar6[1].typeID;
joined_r0x002872d5:
                if (pVVar7 != pVVar5) {
LAB_002872ed:
                  (pVVar5->super_VmValue).hasKnownNonSimpleUse = true;
                  return true;
                }
              }
              else if (uVar2 == 0x1b) {
                VVar3 = pVVar6[1].type.type;
                if (VVar3 == VM_TYPE_VOID) {
LAB_00287317:
                  __assert_fail("index < count",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                ,0x199,
                                "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                               );
                }
                if ((VmConstant *)**(long **)&pVVar6[1].typeID != pVVar5) {
                  if (VVar3 < VM_TYPE_LONG) goto LAB_00287317;
                  pVVar7 = (VmConstant *)(*(long **)&pVVar6[1].typeID)[2];
                  goto joined_r0x002872d5;
                }
              }
              else {
                if (1 < uVar2 - 0x1f) {
                  if (0x10 < uVar2 - 0x33) goto LAB_002872ed;
                  if (pVVar6[1].type.type < VM_TYPE_DOUBLE) goto LAB_00287317;
                  pVVar7 = *(VmConstant **)(*(long *)&pVVar6[1].typeID + 8);
                  goto joined_r0x002872d5;
                }
                if (pVVar5->isReference == false) goto LAB_002872ed;
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
        (pVVar5->super_VmValue).hasKnownSimpleUse = true;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  return false;
}

Assistant:

bool HasAddressTaken(VariableData *container)
{
	if(container->isVmRegSpill)
		return false;

	for(unsigned userPos = 0, userCount = container->users.count; userPos < userCount; userPos++)
	{
		VmConstant *user = container->users.data[userPos];

		if(user->hasKnownSimpleUse)
		{
			assert(!user->hasKnownNonSimpleUse);
			continue;
		}

		if(user->hasKnownNonSimpleUse)
			return true;

		for(unsigned i = 0, e = user->users.count; i < e; i++)
		{
			VmValue *value = user->users.data[i];

			if(VmInstruction *inst = value->typeID == VmInstruction::myTypeID ? static_cast<VmInstruction*>(value) : NULL)
			{
				bool simpleUse = false;

				if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
				{
					simpleUse = true;
				}
				else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
				{
					if(user->isReference)
						simpleUse = true;
					else
						simpleUse = false;
				}
				else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
				{
					simpleUse = true;
				}
				else
				{
					simpleUse = false;
				}

				if(!simpleUse)
				{
					user->hasKnownNonSimpleUse = true;

					return true;
				}
			}
			else
			{
				assert(!"invalid constant use");
			}
		}

		user->hasKnownSimpleUse = true;
	}

	return false;
}